

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Minefield_Data_PDU::Encode(Minefield_Data_PDU *this,KDataStream *stream)

{
  MinefieldDataFilter *this_00;
  byte bVar1;
  KUINT16 PDUL;
  unsigned_short *puVar2;
  Mine *pMVar3;
  KUOCTET *pKVar4;
  _Base_ptr p_Var5;
  byte bVar6;
  KBOOL KVar7;
  KUINT8 V;
  KUINT16 T;
  map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
  *pmVar8;
  Vector *pVVar9;
  EulerAngles *pEVar10;
  ClockTime *pCVar11;
  MineFusing *pMVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar13;
  MinePaintScheme *pMVar14;
  _Rb_tree_node_base *p_Var15;
  KException *this_01;
  uint uVar16;
  uint uVar17;
  byte bVar18;
  _Base_ptr p_Var19;
  pointer pMVar20;
  pointer pMVar21;
  ushort uVar22;
  Mine *pMVar23;
  unsigned_short *puVar24;
  KUOCTET *pKVar25;
  KFLOAT32 KVar26;
  KString local_50;
  
  PDUL = (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  bVar18 = this->m_ui8NumSensTyp;
  bVar6 = calcPaddingPaintScheme(this);
  this_00 = &this->m_DataFilter;
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(this_00);
  uVar17 = 0;
  if (KVar7) {
    uVar16 = 4 - this->m_ui8NumMines;
    uVar17 = 7 - this->m_ui8NumMines;
    if (-1 < (short)uVar16) {
      uVar17 = uVar16;
    }
    uVar17 = uVar16 - (uVar17 & 0xfc) & 0xff;
  }
  uVar22 = (ushort)bVar18 * 2 & 2;
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pMVar21 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar18 = 0;
  if (pMVar20 != pMVar21) {
    do {
      pmVar8 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar20);
      bVar18 = bVar18 + (char)(pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      pMVar20 = pMVar20 + 1;
    } while (pMVar20 != pMVar21);
    bVar18 = bVar18 & 3;
  }
  Header6::SetPDULength
            ((Header6 *)this,
             bVar6 + uVar22 + (short)uVar17 + (ushort)bVar18 +
             (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength);
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ReqID,stream);
  KDataStream::Write<unsigned_short>(stream,(this->m_SeqNumUnion).m_ui16SeqNum);
  KDataStream::Write(stream,this->m_ui8ReqID);
  KDataStream::Write(stream,this->m_ui8PduSeqNum);
  KDataStream::Write(stream,this->m_ui8NumPdus);
  KDataStream::Write(stream,this->m_ui8NumMines);
  KDataStream::Write(stream,this->m_ui8NumSensTyp);
  KDataStream::Write(stream,this->m_ui8Padding1);
  (*(this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase[5])(this_00,stream);
  (*(this->m_MineTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_MineTyp);
  puVar2 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar24 = (this->m_vui16SensorTypes).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar24 != puVar2; puVar24 = puVar24 + 1) {
    KDataStream::Write<unsigned_short>(stream,*puVar24);
  }
  if ((char)uVar22 != '\0') {
    KDataStream::Write<unsigned_short>(stream,0);
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar21 = (this->m_vMines).
                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
                 _M_impl.super__Vector_impl_data._M_start; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1
      ) {
    pVVar9 = DATA_TYPE::Mine::GetLocation(pMVar21);
    (*(pVVar9->super_DataTypeBase)._vptr_DataTypeBase[5])(pVVar9);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsGroundBurialDepthOffset(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1) {
    KVar26 = DATA_TYPE::Mine::GetGroundBurialDepthOffsetValue(pMVar21);
    KDataStream::Write<float>(stream,(float)KVar26);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsWaterBurialDepthOffset(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1) {
    KVar26 = DATA_TYPE::Mine::GetWaterBurialDepthOffsetValue(pMVar21);
    KDataStream::Write<float>(stream,(float)KVar26);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsSnowBurialDepthOffset(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1) {
    KVar26 = DATA_TYPE::Mine::GetSnowBurialDepthOffsetValue(pMVar21);
    KDataStream::Write<float>(stream,(float)KVar26);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsMineOrientation(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1) {
    pEVar10 = DATA_TYPE::Mine::GetMineOrientationValue(pMVar21);
    (*(pEVar10->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar10);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsThermalContrast(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1) {
    KVar26 = DATA_TYPE::Mine::GetThermalContrastValue(pMVar21);
    KDataStream::Write<float>(stream,(float)KVar26);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsReflectance(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar21 != pMVar20; pMVar21 = pMVar21 + 1) {
    KVar26 = DATA_TYPE::Mine::GetReflectanceValue(pMVar21);
    KDataStream::Write<float>(stream,(float)KVar26);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsMineEmplacementAge(this_00);
  pMVar23 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (KVar7) {
    pMVar21 = pMVar23;
  }
  if (pMVar21 != pMVar20) {
    do {
      pCVar11 = DATA_TYPE::Mine::GetMineEmplacementAgeValue(pMVar21);
      (*(pCVar11->super_DataTypeBase)._vptr_DataTypeBase[5])(pCVar11);
      pMVar21 = pMVar21 + 1;
    } while (pMVar21 != pMVar20);
    pMVar23 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pMVar23 != pMVar21; pMVar23 = pMVar23 + 1) {
    T = DATA_TYPE::Mine::GetID(pMVar23);
    KDataStream::Write<unsigned_short>(stream,T);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsFusing(this_00);
  if (KVar7) {
    pMVar23 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar23 != pMVar20; pMVar23 = pMVar23 + 1) {
    pMVar12 = DATA_TYPE::Mine::GetFusingValue(pMVar23);
    (*(pMVar12->super_DataTypeBase)._vptr_DataTypeBase[5])(pMVar12);
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(this_00);
  if (KVar7) {
    pMVar3 = (this->m_vMines).
             super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pMVar23 = (this->m_vMines).
                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar23 != pMVar3;
        pMVar23 = pMVar23 + 1) {
      bVar1 = this->m_ui8NumSensTyp;
      pvVar13 = DATA_TYPE::Mine::GetScalarDetectionCoefficientValues(pMVar23);
      if ((long)(pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start != (ulong)bVar1) {
        this_01 = (KException *)__cxa_allocate_exception(0x30);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Encode","");
        KException::KException<char_const*>
                  (this_01,&local_50,8,
                   "Mine does not have the correct number of scalar detection                                                               coefficient values. Each mine must have the same number of                                                               SDC values as sensor types"
                  );
        __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
      }
      pvVar13 = DATA_TYPE::Mine::GetScalarDetectionCoefficientValues(pMVar23);
      pKVar25 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pvVar13 = DATA_TYPE::Mine::GetScalarDetectionCoefficientValues(pMVar23);
      pKVar4 = (pvVar13->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (; pKVar25 != pKVar4; pKVar25 = pKVar25 + 1) {
        KDataStream::Write(stream,*pKVar25);
      }
    }
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(this_00);
  if (KVar7) {
    pMVar23 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  pMVar20 = (this->m_vMines).
            super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (; pMVar23 != pMVar20; pMVar23 = pMVar23 + 1) {
    pMVar14 = DATA_TYPE::Mine::GetPaintSchemeValue(pMVar23);
    (*(pMVar14->super_DataTypeBase)._vptr_DataTypeBase[5])(pMVar14);
  }
  for (; bVar6 != 0; bVar6 = bVar6 - 1) {
    KDataStream::Write(stream,'\0');
  }
  KVar7 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(this_00);
  if (KVar7) {
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pMVar20 = (this->m_vMines).
                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar20 != pMVar21;
        pMVar20 = pMVar20 + 1) {
      V = DATA_TYPE::Mine::GetNumberTripDetonationWires(pMVar20);
      KDataStream::Write(stream,V);
    }
    for (; uVar17 != 0; uVar17 = uVar17 - 1) {
      KDataStream::Write(stream,'\0');
    }
    pMVar21 = (this->m_vMines).
              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pMVar20 = (this->m_vMines).
                   super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar20 != pMVar21;
        pMVar20 = pMVar20 + 1) {
      pmVar8 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar20);
      p_Var15 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar8 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar20);
      for (; (_Rb_tree_header *)p_Var15 != &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
        KDataStream::Write(stream,(char)((uint)(*(int *)&p_Var15[1]._M_left -
                                               *(int *)&p_Var15[1]._M_parent) >> 3) * -0x55);
      }
    }
  }
  for (; bVar18 != 0; bVar18 = bVar18 - 1) {
    KDataStream::Write(stream,'\0');
  }
  pMVar3 = (this->m_vMines).
           super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pMVar23 = (this->m_vMines).
                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
                 _M_impl.super__Vector_impl_data._M_start; pMVar23 != pMVar3; pMVar23 = pMVar23 + 1)
  {
    pmVar8 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar23);
    p_Var15 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar8 = DATA_TYPE::Mine::GetTripDetonationWire(pMVar23);
    for (; (_Rb_tree_header *)p_Var15 != &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      p_Var5 = p_Var15[1]._M_left;
      for (p_Var19 = p_Var15[1]._M_parent; p_Var19 != p_Var5;
          p_Var19 = (_Base_ptr)&p_Var19->_M_right) {
        (**(code **)(*(long *)p_Var19 + 0x28))(p_Var19,stream);
      }
    }
  }
  Header6::SetPDULength((Header6 *)this,PDUL);
  return;
}

Assistant:

void Minefield_Data_PDU::Encode(KDataStream &stream) const noexcept(false)
{
    // Calculate padding first and add it to the pdu length
    KUINT16 m_ui16OldLength = m_ui16PDULength;
    KUINT8 ui8PaddingNeeded1 = ( m_ui8NumSensTyp % 2 ) * 2;
    KUINT8 ui8PaddingNeeded2 = calcPaddingPaintScheme();
    KUINT8 ui8PaddingNeeded3 = 0;
    if( m_DataFilter.IsTripDetonationWire() )ui8PaddingNeeded3 += ( 4 - m_ui8NumMines ) % 4;
    KUINT8 ui8PaddingNeeded4 = calcPaddingVertices();
    KUINT8 ui8Pad = 0;

    // Add all the padding to the PDU length
    Header * pHead = ( Header* )this;
    pHead->SetPDULength( m_ui16PDULength + ui8PaddingNeeded1 + ui8PaddingNeeded2 + ui8PaddingNeeded3 + ui8PaddingNeeded4 );

    Minefield_Header::Encode( stream );

    stream << KDIS_STREAM m_ReqID
           << m_SeqNumUnion.m_ui16SeqNum
           << m_ui8ReqID
           << m_ui8PduSeqNum
           << m_ui8NumPdus
           << m_ui8NumMines
           << m_ui8NumSensTyp
           << m_ui8Padding1
           << KDIS_STREAM m_DataFilter
           << KDIS_STREAM m_MineTyp;

    // Sensor Types
    vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    vector<KUINT16>::const_iterator citrStEnd = m_vui16SensorTypes.end();
    for( ; citrSt != citrStEnd; ++citrSt )
    {
        stream << *citrSt;
    }

    if( ui8PaddingNeeded1 )
    {
        KUINT16 ui16Pad = 0;
        stream << ui16Pad;
    }

    /************************************************************************/
    /* Mines                                                                */
    /************************************************************************/
    vector<Mine>::const_iterator citrMn;
    vector<Mine>::const_iterator citrMnEnd;

    MINE_ENCODE_CLASS( GetLocation )

    // The following are all dependent on the data filter( except ID ):
    if( m_DataFilter.IsGroundBurialDepthOffset() )  MINE_ENCODE_NATIVE( GetGroundBurialDepthOffsetValue )
        if( m_DataFilter.IsWaterBurialDepthOffset() )   MINE_ENCODE_NATIVE( GetWaterBurialDepthOffsetValue )
            if( m_DataFilter.IsSnowBurialDepthOffset() )    MINE_ENCODE_NATIVE( GetSnowBurialDepthOffsetValue )
                if( m_DataFilter.IsMineOrientation() )          MINE_ENCODE_CLASS( GetMineOrientationValue )
                    if( m_DataFilter.IsThermalContrast() )          MINE_ENCODE_NATIVE( GetThermalContrastValue )
                        if( m_DataFilter.IsReflectance() )              MINE_ENCODE_NATIVE( GetReflectanceValue )
                            if( m_DataFilter.IsMineEmplacementAge() )       MINE_ENCODE_CLASS( GetMineEmplacementAgeValue )
                                MINE_ENCODE_NATIVE( GetID )
                                if( m_DataFilter.IsFusing() )                   MINE_ENCODE_CLASS( GetFusingValue )

                                    if( m_DataFilter.IsScalarDetectionCoefficient() )
                                    {
                                        citrMnEnd = m_vMines.end();
                                        citrMn = m_vMines.begin();
                                        for( ; citrMn != citrMnEnd; ++citrMn )
                                        {
                                            // First check that the mine has the correct number of SDC.
                                            if( m_ui8NumSensTyp != citrMn->GetScalarDetectionCoefficientValues().size() )
                                            {
                                                throw KException( __FUNCTION__, INVALID_DATA, "Mine does not have the correct number of scalar detection \
                                                              coefficient values. Each mine must have the same number of \
                                                              SDC values as sensor types" );
                                            }

                                            vector<KUINT8>::const_iterator citrSDC = citrMn->GetScalarDetectionCoefficientValues().begin();
                                            vector<KUINT8>::const_iterator citrSDCEnd = citrMn->GetScalarDetectionCoefficientValues().end();
                                            for( ; citrSDC != citrSDCEnd; ++citrSDC )
                                            {
                                                stream << *citrSDC;
                                            }
                                        }
                                    }

    if( m_DataFilter.IsPaintScheme() ) MINE_ENCODE_CLASS( GetPaintSchemeValue )

        // Do we need to add padding?
        for( KUINT8 i = 0; i < ui8PaddingNeeded2; ++i )
        {
            stream << ui8Pad;
        }

    // Trip/Det wires
    if( m_DataFilter.IsTripDetonationWire() )
    {
        MINE_ENCODE_NATIVE( GetNumberTripDetonationWires )

        // Do we need more padding? [(4-n) mod4] 8[F(7)]
        for( KUINT8 i = 0; i < ui8PaddingNeeded3; ++i )
        {
            stream << ui8Pad;
        }

        // Number of vertices's field
        citrMnEnd = m_vMines.end();
        citrMn = m_vMines.begin();
        for( ; citrMn != citrMnEnd; ++citrMn )
        {
            map< KUINT16, vector<Vector> >::const_iterator citrWr = citrMn->GetTripDetonationWire().begin();
            map< KUINT16, vector<Vector> >::const_iterator citrWrEnd = citrMn->GetTripDetonationWire().end();
            for( ; citrWr != citrWrEnd; ++citrWr )
            {
                stream << ( KUINT8 )citrWr->second.size();
            }
        }
    }

    // Padding?
    for( KUINT8 i = 0; i < ui8PaddingNeeded4; ++i )
    {
        stream << ui8Pad;
    }

    // Vertices's
    citrMnEnd = m_vMines.end();
    citrMn = m_vMines.begin();
    for( ; citrMn != citrMnEnd; ++citrMn )
    {
        map< KUINT16, vector<Vector> >::const_iterator citrWr = citrMn->GetTripDetonationWire().begin();
        map< KUINT16, vector<Vector> >::const_iterator citrWrEnd = citrMn->GetTripDetonationWire().end();
        for( ; citrWr != citrWrEnd; ++citrWr )
        {
            vector<Vector>::const_iterator citrVr = citrWr->second.begin();
            vector<Vector>::const_iterator citrVrEnd = citrWr->second.end();
            for( ; citrVr != citrVrEnd; ++citrVr )
            {
                stream << KDIS_STREAM *citrVr;
            }
        }
    }

    // Reset the length for the next encode
    pHead->SetPDULength( m_ui16OldLength );
}